

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O0

void duckdb_lz4::LZ4_prepareTable(LZ4_stream_t_internal *cctx,int inputSize,tableType_t tableType)

{
  int in_EDX;
  int in_ESI;
  void *in_RDI;
  
  if ((*(int *)((long)in_RDI + 0x4014) != 0) &&
     ((((*(int *)((long)in_RDI + 0x4014) != in_EDX ||
        ((in_EDX == 3 && (0xfffe < (uint)(*(int *)((long)in_RDI + 0x4010) + in_ESI))))) ||
       ((in_EDX == 2 && (0x40000000 < *(uint *)((long)in_RDI + 0x4010))))) ||
      ((in_EDX == 1 || (0xfff < in_ESI)))))) {
    memset(in_RDI,0,0x4000);
    *(undefined4 *)((long)in_RDI + 0x4010) = 0;
    *(undefined4 *)((long)in_RDI + 0x4014) = 0;
  }
  if ((*(int *)((long)in_RDI + 0x4010) != 0) && (in_EDX == 2)) {
    *(int *)((long)in_RDI + 0x4010) = *(int *)((long)in_RDI + 0x4010) + 0x10000;
  }
  *(undefined8 *)((long)in_RDI + 0x4008) = 0;
  *(undefined8 *)((long)in_RDI + 0x4000) = 0;
  *(undefined4 *)((long)in_RDI + 0x4018) = 0;
  return;
}

Assistant:

LZ4_FORCE_INLINE void
LZ4_prepareTable(LZ4_stream_t_internal* const cctx,
           const int inputSize,
           const tableType_t tableType) {
    /* If the table hasn't been used, it's guaranteed to be zeroed out, and is
     * therefore safe to use no matter what mode we're in. Otherwise, we figure
     * out if it's safe to leave as is or whether it needs to be reset.
     */
    if ((tableType_t)cctx->tableType != clearedTable) {
        assert(inputSize >= 0);
        if ((tableType_t)cctx->tableType != tableType
          || ((tableType == byU16) && cctx->currentOffset + (unsigned)inputSize >= 0xFFFFU)
          || ((tableType == byU32) && cctx->currentOffset > 1 GB)
          || tableType == byPtr
          || inputSize >= 4 KB)
        {
            DEBUGLOG(4, "LZ4_prepareTable: Resetting table in %p", cctx);
            MEM_INIT(cctx->hashTable, 0, LZ4_HASHTABLESIZE);
            cctx->currentOffset = 0;
            cctx->tableType = (U32)clearedTable;
        } else {
            DEBUGLOG(4, "LZ4_prepareTable: Re-use hash table (no reset)");
        }
    }

    /* Adding a gap, so all previous entries are > LZ4_DISTANCE_MAX back,
     * is faster than compressing without a gap.
     * However, compressing with currentOffset == 0 is faster still,
     * so we preserve that case.
     */
    if (cctx->currentOffset != 0 && tableType == byU32) {
        DEBUGLOG(5, "LZ4_prepareTable: adding 64KB to currentOffset");
        cctx->currentOffset += 64 KB;
    }

    /* Finally, clear history */
    cctx->dictCtx = NULL;
    cctx->dictionary = NULL;
    cctx->dictSize = 0;
}